

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O3

size_t __thiscall
cappuccino::
ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::clean_expired_values
          (ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this)

{
  int iVar1;
  time_point now;
  size_t sVar2;
  undefined8 uVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    sVar2 = do_prune(this,now);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return sVar2;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

auto clean_expired_values() -> size_t
    {
        std::lock_guard guard{m_lock};
        const auto      now = std::chrono::steady_clock::now();
        return do_prune(now);
    }